

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O3

void Gia_Iso2ManCollectOrder_rec
               (Gia_Man_t *p,int Id,Vec_Int_t *vRoots,Vec_Int_t *vVec,Vec_Int_t *vMap)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  if (p->nTravIdsAlloc <= Id) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x22c,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
  }
  if (p->pTravIds[Id] == p->nTravIds) {
    return;
  }
  p->pTravIds[Id] = p->nTravIds;
  if ((-1 < Id) && (Id < p->nObjs)) {
    uVar4 = *(ulong *)(p->pObjs + (uint)Id);
    uVar6 = (uint)uVar4;
    uVar7 = uVar4 & 0x1fffffff;
    uVar5 = (uint)(uVar4 >> 0x20);
    if (uVar7 == 0x1fffffff || (int)uVar6 < 0) {
      if ((int)uVar6 < 0 && (int)uVar7 != 0x1fffffff) {
        Gia_Iso2ManCollectOrder_rec(p,Id - (uVar6 & 0x1fffffff),vRoots,vVec,vMap);
      }
      else if ((~uVar6 & 0x9fffffff) == 0) {
        iVar2 = p->vCis->nSize;
        if (iVar2 - p->nRegs <= (int)(uVar5 & 0x1fffffff)) {
          iVar3 = p->vCos->nSize;
          uVar6 = (iVar3 - iVar2) + (uVar5 & 0x1fffffff);
          if (((int)uVar6 < 0) || (iVar3 <= (int)uVar6)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar6 = p->vCos->pArray[uVar6];
          if (((int)uVar6 < 0) || ((uint)p->nObjs <= uVar6)) goto LAB_006cc1f6;
          Vec_IntPush(vRoots,uVar6);
        }
      }
      else if ((~uVar4 & 0x1fffffff1fffffff) != 0) {
        __assert_fail("Gia_ObjIsConst0(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIso2.c"
                      ,0x1ce,
                      "void Gia_Iso2ManCollectOrder_rec(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
    }
    else {
      pGVar1 = p->pObjs + (uint)Id;
      if (pGVar1[-(ulong)(uVar5 & 0x1fffffff)].Value < pGVar1[-uVar7].Value) {
        Gia_Iso2ManCollectOrder_rec(p,Id - (uVar5 & 0x1fffffff),vRoots,vVec,vMap);
        uVar6 = *(uint *)pGVar1;
      }
      else {
        Gia_Iso2ManCollectOrder_rec(p,Id - (uVar6 & 0x1fffffff),vRoots,vVec,vMap);
        uVar6 = *(uint *)&pGVar1->field_0x4;
      }
      Gia_Iso2ManCollectOrder_rec(p,Id - (uVar6 & 0x1fffffff),vRoots,vVec,vMap);
    }
    if (Id < vMap->nSize) {
      vMap->pArray[(uint)Id] = vVec->nSize;
      Vec_IntPush(vVec,Id);
      return;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
LAB_006cc1f6:
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

void Gia_Iso2ManCollectOrder_rec( Gia_Man_t * p, int Id, Vec_Int_t * vRoots, Vec_Int_t * vVec, Vec_Int_t * vMap )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, Id) )
        return;
    Gia_ObjSetTravIdCurrentId(p, Id);
    pObj = Gia_ManObj( p, Id );
    if ( Gia_ObjIsAnd(pObj) )
    {
        if ( Gia_ObjFanin0(pObj)->Value <= Gia_ObjFanin1(pObj)->Value )
        {
            Gia_Iso2ManCollectOrder_rec( p, Gia_ObjFaninId0(pObj, Id), vRoots, vVec, vMap );
            Gia_Iso2ManCollectOrder_rec( p, Gia_ObjFaninId1(pObj, Id), vRoots, vVec, vMap );
        }
        else
        {
            Gia_Iso2ManCollectOrder_rec( p, Gia_ObjFaninId1(pObj, Id), vRoots, vVec, vMap );
            Gia_Iso2ManCollectOrder_rec( p, Gia_ObjFaninId0(pObj, Id), vRoots, vVec, vMap );
        }
    }
    else if ( Gia_ObjIsCo(pObj) )
    {
        Gia_Iso2ManCollectOrder_rec( p, Gia_ObjFaninId0(pObj, Id), vRoots, vVec, vMap );
    }
    else if ( Gia_ObjIsCi(pObj) )
    {
        if ( Gia_ObjIsRo(p, pObj) )
            Vec_IntPush( vRoots, Gia_ObjId(p, Gia_ObjRoToRi(p, pObj)) );
    }
    else assert( Gia_ObjIsConst0(pObj) );
    Vec_IntWriteEntry( vMap, Id, Vec_IntSize(vVec) );
    Vec_IntPush( vVec, Id );
}